

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

void __thiscall
slang::ast::SampledValueExprVisitor::visit<slang::ast::StructuredAssignmentPatternExpression>
          (SampledValueExprVisitor *this,StructuredAssignmentPatternExpression *expr)

{
  ExpressionKind EVar1;
  bool bVar2;
  Symbol *this_00;
  AssertionPortSymbol *pAVar3;
  CallExpression *this_01;
  Type *this_02;
  size_t sVar4;
  string_view __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view local_28;
  
  EVar1 = (expr->super_AssignmentPatternExpressionBase).super_Expression.kind;
  if (EVar1 == Call) {
    this_01 = Expression::as<slang::ast::CallExpression>((Expression *)expr);
    if (*(__index_type *)
         ((long)&(this_01->subroutine).
                 super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                 .
                 super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                 .
                 super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                 .
                 super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                 .
                 super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                 .
                 super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
         + 0x30) == '\x01') {
      __x = CallExpression::getSubroutineName(this_01);
      __y._M_str = "matched";
      __y._M_len = 7;
      bVar2 = std::operator==(__x,__y);
      if ((bVar2) && ((this_01->arguments_).size_ != 0)) {
        this_02 = not_null<const_slang::ast::Type_*>::get(&(*(this_01->arguments_).data_)->type);
        bVar2 = Type::isSequenceType(this_02);
        if (bVar2) {
          ASTContext::addDiag(this->context,this->matchedCode,
                              (expr->super_AssignmentPatternExpressionBase).super_Expression.
                              sourceRange);
        }
      }
      if (this->isFutureGlobal == true) {
        local_28 = CallExpression::getSubroutineName(this_01);
        sVar4 = ska::detailv3::
                sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                ::count(&FutureGlobalNames.
                         super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        ,&local_28);
        if (sVar4 != 0) {
          ASTContext::addDiag(this->context,(DiagCode)0x180008,
                              (expr->super_AssignmentPatternExpressionBase).super_Expression.
                              sourceRange);
        }
      }
    }
  }
  else {
    if (EVar1 != NamedValue) {
      AssignmentPatternExpressionBase::visitExprs<slang::ast::SampledValueExprVisitor&>
                (&expr->super_AssignmentPatternExpressionBase,this);
      return;
    }
    this_00 = Expression::getSymbolReference((Expression *)expr,true);
    if (this_00 != (Symbol *)0x0) {
      if (this_00->kind == LocalAssertionVar) {
LAB_003049ae:
        ASTContext::addDiag(this->context,this->localVarCode,
                            (expr->super_AssignmentPatternExpressionBase).super_Expression.
                            sourceRange);
        return;
      }
      if (this_00->kind == AssertionPort) {
        pAVar3 = Symbol::as<slang::ast::AssertionPortSymbol>(this_00);
        if ((pAVar3->localVarDirection).
            super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged == true)
        goto LAB_003049ae;
      }
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                    if (auto sym = expr.getSymbolReference()) {
                        if (sym->kind == SymbolKind::LocalAssertionVar ||
                            (sym->kind == SymbolKind::AssertionPort &&
                             sym->template as<AssertionPortSymbol>().isLocalVar())) {
                            context.addDiag(localVarCode, expr.sourceRange);
                        }
                    }
                    break;
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.isSystemCall()) {
                        if (call.getSubroutineName() == "matched"sv && !call.arguments().empty() &&
                            call.arguments()[0]->type->isSequenceType()) {
                            context.addDiag(matchedCode, expr.sourceRange);
                        }

                        if (isFutureGlobal && FutureGlobalNames.count(call.getSubroutineName())) {
                            context.addDiag(diag::GlobalSampledValueNested, expr.sourceRange);
                        }
                    }
                    break;
                }
                default:
                    if constexpr (is_detected_v<ASTDetectors::visitExprs_t, T,
                                                SampledValueExprVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }